

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cpp
# Opt level: O1

void opt_Pop(void)

{
  OptStackEntry *__ptr;
  long lVar1;
  WarningState *pWVar2;
  WarningState *pWVar3;
  byte bVar4;
  
  __ptr = stack;
  bVar4 = 0;
  if (stack != (OptStackEntry *)0x0) {
    binDigits[0] = stack->binary[0];
    binDigits[1] = stack->binary[1];
    gfxDigits[0] = stack->gbgfx[0];
    gfxDigits[1] = stack->gbgfx[1];
    gfxDigits[2] = stack->gbgfx[2];
    gfxDigits[3] = stack->gbgfx[3];
    fillByte = stack->fillByte;
    fixPrecision = stack->fixPrecision;
    warnOnHaltNop = stack->warnOnHaltNop;
    haltNop = stack->haltNop;
    optimizeLoads = stack->optimizeLoads;
    warnOnLdOpt = stack->warnOnLdOpt;
    fstk_NewRecursionDepth(stack->maxRecursionDepth);
    lexer_CheckRecursionDepth();
    warningsAreErrors = __ptr->warningsAreErrors;
    pWVar2 = __ptr->warningStates;
    pWVar3 = warningStates;
    for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pWVar3 = *(undefined8 *)pWVar2;
      pWVar2 = pWVar2 + (ulong)bVar4 * -4 + 2;
      pWVar3 = pWVar3 + ((ulong)bVar4 * -2 + 1) * 2;
    }
    stack = __ptr->next;
    free(__ptr);
    return;
  }
  error("No entries in the option stack\n");
  return;
}

Assistant:

void opt_Pop(void)
{
	if (stack == NULL) {
		error("No entries in the option stack\n");
		return;
	}

	struct OptStackEntry *entry = stack;

	opt_B(entry->binary);
	opt_G(entry->gbgfx);
	opt_P(entry->fillByte);
	opt_Q(entry->fixPrecision);
	opt_H(entry->warnOnHaltNop);
	opt_h(entry->haltNop);
	opt_L(entry->optimizeLoads);
	opt_l(entry->warnOnLdOpt);
	opt_R(entry->maxRecursionDepth);

	// opt_W does not apply a whole warning state; it processes one flag string
	warningsAreErrors = entry->warningsAreErrors;
	memcpy(warningStates, entry->warningStates, numWarningStates);

	stack = entry->next;
	free(entry);
}